

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.h
# Opt level: O2

void __thiscall Threadpool::add_thread(Threadpool *this,unsigned_short size)

{
  bool bVar1;
  anon_class_8_1_8991fb9c_for__M_head_impl local_20;
  
  while( true ) {
    bVar1 = size == 0;
    size = size - 1;
    if ((0x1ff < (ulong)((long)(this->tp_pool).
                               super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(this->tp_pool).
                              super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                              super__Vector_impl_data._M_start)) || (bVar1)) break;
    local_20.this = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<Threadpool::add_thread(unsigned_short)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)this,&local_20);
    LOCK();
    (this->tp_idl_tnum).super___atomic_base<int>._M_i =
         (this->tp_idl_tnum).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void add_thread(unsigned short size)
	{
		for (; tp_pool.size() < THREADPOOL_MAX_NUM && size > 0; --size)
		{
			tp_pool.emplace_back( [this]{
				while (tp_run)
				{
					Task task;
					{
						unique_lock<mutex> lock{ tp_lock };
						tp_task_cv.wait(lock, [this]{
								return !tp_run || !tp_tasks.empty();
						});
						if (!tp_run && tp_tasks.empty())
							return;
						task = move(tp_tasks.front());
						tp_tasks.pop();
					}
					tp_idl_tnum--;
					task();
					tp_idl_tnum++;
				}
			});
			tp_idl_tnum++;
		}
	}